

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall
optTyped_defaultConstructorRvalue_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>::TestBody
          (optTyped_defaultConstructorRvalue_Test<mp::opt<bool,_mp::opt_default_policy<bool>_>_>
           *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar_;
  AssertHelper local_30;
  storage_type local_28;
  undefined7 uStack_27;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  AssertHelper local_18;
  
  local_28.value = true;
  local_20.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_28.value = true;
  local_20.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_28.null_value = -1;
    mp::opt<bool,_mp::opt_default_policy<bool>_>::value
              ((opt<bool,_mp::opt_default_policy<bool>_> *)&local_28);
  }
  testing::Message::Message((Message *)&local_28);
  testing::internal::AssertHelper::AssertHelper
            (&local_30,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
             0x11d,
             "Expected: make().value() throws an exception of type bad_optional_access.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_30,(Message *)&local_28);
  testing::internal::AssertHelper::~AssertHelper(&local_30);
  if (CONCAT71(uStack_27,local_28.value) != 0) {
    bVar1 = testing::internal::IsTrue(true);
    if ((bVar1) && ((long *)CONCAT71(uStack_27,local_28.value) != (long *)0x0)) {
      (**(code **)(*(long *)CONCAT71(uStack_27,local_28.value) + 8))();
    }
  }
  local_30.data_._0_1_ =
       (this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).value_2 & 1;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_28,"this->value_2","make().value_or(this->value_2)",
             &(this->super_optTyped<mp::opt<bool,_mp::opt_default_policy<bool>_>_>).value_2,
             (bool *)&local_30);
  if (local_28.value == false) {
    testing::Message::Message((Message *)&local_30);
    if (local_20.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_20.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/mpusz[P]opt/src/tests/tests.cpp",
               0x11e,message);
    testing::internal::AssertHelper::operator=(&local_18,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_18);
    if (CONCAT71(local_30.data_._1_7_,(byte)local_30.data_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_30.data_._1_7_,(byte)local_30.data_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_30.data_._1_7_,(byte)local_30.data_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_20,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TYPED_TEST(optTyped, defaultConstructorRvalue)
{
  using opt_type = typename TestFixture::type;
  auto make = [] { return opt_type{}; };
  EXPECT_FALSE(make());
  EXPECT_FALSE(make().has_value());
  EXPECT_THROW(make().value(), bad_optional_access);
  EXPECT_EQ(this->value_2, make().value_or(this->value_2));
}